

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strpool.h
# Opt level: O1

unsigned_long_long strpool_inject(strpool_t *pool,char *string,int length)

{
  strpool_t *psVar1;
  char cVar2;
  int iVar3;
  strpool_internal_hash_slot_t *psVar4;
  strpool_internal_block_t *psVar5;
  char *pcVar6;
  bool bVar7;
  int iVar8;
  int iVar9;
  ulong uVar10;
  strpool_internal_hash_slot_t *psVar11;
  long lVar12;
  strpool_internal_entry_t *psVar13;
  strpool_internal_handle_t *__dest;
  char **ppcVar14;
  int iVar15;
  char cVar16;
  int iVar17;
  long lVar18;
  ulong uVar19;
  uint uVar20;
  ulong uVar21;
  uint uVar22;
  uint uVar23;
  ulong uVar24;
  ulong __n;
  uint uVar25;
  uint uVar26;
  strpool_t *psVar27;
  bool bVar28;
  unsigned_long_long local_68;
  
  uVar25 = 0;
  if (length < 0 || string == (char *)0x0) {
    return 0;
  }
  __n = (ulong)(uint)length;
  if (0 < (long)pool->block_count) {
    lVar18 = 0;
    do {
      lVar12 = *(long *)((long)&pool->blocks->data + lVar18);
      bVar28 = true;
      if (((char *)(lVar12 + 8U) <= string) &&
         (string < (char *)(lVar12 + *(int *)((long)&pool->blocks->capacity + lVar18)))) {
        bVar28 = false;
        uVar25 = 0;
        if (*(int *)(string + -4) == length) {
          bVar28 = false;
          uVar25 = 0;
          if (string[__n] == '\0') {
            uVar25 = *(uint *)(string + -8);
            bVar28 = false;
          }
        }
      }
      if (!bVar28) goto LAB_00103411;
      lVar18 = lVar18 + 0x20;
    } while ((long)pool->block_count * 0x20 != lVar18);
    uVar25 = 0;
  }
LAB_00103411:
  if (uVar25 != 0) goto LAB_00103490;
  if (pool->ignore_case == 0) {
    if (length < 1) goto LAB_00103482;
    uVar25 = 0x1505;
    uVar10 = 0;
    do {
      uVar25 = uVar25 * 0x21 ^ (int)string[uVar10];
      uVar10 = uVar10 + 1;
    } while (__n != uVar10);
  }
  else if (length < 1) {
LAB_00103482:
    uVar25 = 0x1505;
  }
  else {
    uVar25 = 0x1505;
    uVar10 = 0;
    do {
      cVar2 = string[uVar10];
      cVar16 = cVar2 + -0x20;
      if (0x19 < (byte)(cVar2 + 0x9fU)) {
        cVar16 = cVar2;
      }
      uVar25 = (int)cVar16 ^ uVar25 * 0x21;
      uVar10 = uVar10 + 1;
    } while (__n != uVar10);
  }
  uVar25 = uVar25 + (uVar25 == 0);
LAB_00103490:
  iVar9 = pool->hash_capacity;
  lVar18 = (long)iVar9;
  uVar20 = iVar9 - 1;
  uVar23 = uVar20 & uVar25;
  psVar4 = pool->hash_table;
  psVar27 = (strpool_t *)(ulong)(uint)psVar4[(int)uVar23].base_count;
  uVar10 = (ulong)uVar23;
  uVar22 = uVar23;
  while (iVar15 = (int)psVar27, 0 < iVar15) {
    uVar26 = psVar4[(int)uVar22].hash_key;
    if ((uVar26 == 0) && (psVar4[(int)uVar10].hash_key != 0)) {
      uVar10 = (ulong)uVar22;
    }
    if (((uVar26 & uVar20) == uVar23) &&
       (psVar27 = (strpool_t *)(ulong)(iVar15 - 1), uVar26 == uVar25)) {
      iVar15 = psVar4[(int)uVar22].entry_index;
      psVar13 = pool->entries;
      bVar28 = true;
      if (psVar13[iVar15].length == length) {
        if (pool->ignore_case == 0) {
          iVar8 = bcmp(psVar13[iVar15].data + 8,string,__n);
        }
        else {
          iVar8 = strncasecmp(psVar13[iVar15].data + 8,string,__n);
        }
        bVar28 = true;
        if (iVar8 == 0) {
          local_68 = (long)psVar13[iVar15].handle_index + 1U & pool->index_mask |
                     ((long)pool->handles[psVar13[iVar15].handle_index].counter & pool->counter_mask
                     ) << ((byte)pool->counter_shift & 0x3f);
          bVar28 = false;
        }
      }
      if (bVar28) goto LAB_001035d9;
      bVar28 = false;
    }
    else {
LAB_001035d9:
      uVar22 = uVar22 + 1 & uVar20;
      bVar28 = true;
    }
    if (!bVar28) {
      return local_68;
    }
  }
  iVar8 = (int)((ulong)(lVar18 * 0x55555555) >> 0x20) - iVar9;
  if (((iVar8 >> 1) - (iVar8 >> 0x1f)) + iVar9 <= pool->entry_count) {
    pool->hash_capacity = iVar9 * 2;
    psVar11 = (strpool_internal_hash_slot_t *)
              (**pool->memctx)(0,lVar18 * 0x18,0,0,0,0,*(undefined8 *)((long)pool->memctx + 8));
    pool->hash_table = psVar11;
    if (psVar11 == (strpool_internal_hash_slot_t *)0x0) {
      __assert_fail("pool->hash_table",
                    "/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/../3rdparty/mattias/strpool.h"
                    ,0x33c,"void strpool_internal_expand_hash_table(strpool_t *)");
    }
    memset(psVar11,0,(long)pool->hash_capacity * 0xc);
    if (0 < iVar9) {
      lVar12 = 0;
      do {
        uVar22 = psVar4[lVar12].hash_key;
        if ((long)(int)uVar22 != 0) {
          uVar24 = (long)pool->hash_capacity - 1;
          uVar19 = uVar24 & (long)(int)uVar22;
          psVar11 = pool->hash_table;
          uVar20 = psVar11[uVar19].hash_key;
          uVar10 = uVar19;
          uVar21 = uVar19;
          while (uVar20 != 0) {
            uVar20 = (int)uVar21 + 1U & (uint)uVar24;
            uVar21 = (ulong)uVar20;
            uVar10 = (ulong)(int)uVar20;
            uVar20 = psVar11[uVar10].hash_key;
          }
          psVar11[uVar10].hash_key = uVar22;
          iVar9 = psVar4[lVar12].entry_index;
          psVar11[uVar10].entry_index = iVar9;
          pool->entries[iVar9].hash_slot = (int)uVar21;
          psVar11[uVar19].base_count = psVar11[uVar19].base_count + 1;
        }
        lVar12 = lVar12 + 1;
      } while (lVar12 != lVar18);
    }
    (**pool->memctx)(psVar4,0,0,0,0,0,*(undefined8 *)((long)pool->memctx + 8));
    uVar22 = pool->hash_capacity - 1;
    uVar23 = uVar22 & uVar25;
    if (iVar15 == 0) {
      uVar10 = (ulong)uVar23;
    }
    else {
      uVar10 = (ulong)uVar23;
      uVar20 = uVar23;
      do {
        uVar26 = pool->hash_table[(int)uVar20].hash_key;
        if ((uVar26 == 0) && (pool->hash_table[(int)uVar10].hash_key != 0)) {
          uVar10 = (ulong)uVar20;
        }
        uVar20 = uVar20 + 1 & uVar22;
        uVar26 = (int)psVar27 - (uint)((uVar26 & uVar22) == uVar23);
        psVar27 = (strpool_t *)(ulong)uVar26;
      } while (uVar26 != 0);
    }
  }
  uVar21 = (ulong)(int)uVar10;
  if (pool->hash_table[uVar21].hash_key != 0) {
    uVar21 = uVar10;
    do {
      uVar21 = (long)(int)uVar21 + 1U & (long)pool->hash_capacity - 1U;
      uVar10 = uVar21;
    } while (pool->hash_table[uVar21].hash_key != 0);
  }
  iVar9 = pool->entry_capacity;
  if (iVar9 <= pool->entry_count) {
    pool->entry_capacity = iVar9 * 2;
    psVar13 = (strpool_internal_entry_t *)
              (**pool->memctx)(0,(long)iVar9 << 6,0,0,0,0,*(undefined8 *)((long)pool->memctx + 8));
    if (psVar13 == (strpool_internal_entry_t *)0x0) {
      __assert_fail("new_entries",
                    "/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/../3rdparty/mattias/strpool.h"
                    ,0x359,"void strpool_internal_expand_entries(strpool_t *)");
    }
    memcpy(psVar13,pool->entries,(long)pool->entry_count << 5);
    (**pool->memctx)(pool->entries,0,0,0,0,0,*(undefined8 *)((long)pool->memctx + 8));
    pool->entries = psVar13;
    psVar27 = pool;
  }
  psVar4 = pool->hash_table;
  if ((psVar4[uVar21].hash_key != 0) || ((pool->hash_capacity - 1U & uVar25) != uVar23)) {
    __assert_fail("!pool->hash_table[ slot ].hash_key && ( hash & ( (unsigned int) pool->hash_capacity - 1 ) ) == (unsigned int) base_slot"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/../3rdparty/mattias/strpool.h"
                  ,0x3e9,"unsigned long long strpool_inject(strpool_t *, const char *, int)");
  }
  psVar4[uVar21].hash_key = uVar25;
  psVar4[uVar21].entry_index = pool->entry_count;
  psVar4[(int)uVar23].base_count = psVar4[(int)uVar23].base_count + 1;
  iVar9 = pool->handle_count;
  iVar15 = pool->handle_capacity;
  if (iVar9 < iVar15) {
    pool->handles[iVar9].counter = 1;
    pool->handle_count = iVar9 + 1;
  }
  else {
    iVar9 = pool->handle_freelist_head;
    lVar18 = (long)iVar9;
    if (lVar18 < 0) {
      pool->handle_capacity = iVar15 * 2;
      __dest = (strpool_internal_handle_t *)
               (**pool->memctx)(0,(long)iVar15 << 4,0,0,0,0,*(undefined8 *)((long)pool->memctx + 8))
      ;
      if (__dest == (strpool_internal_handle_t *)0x0) {
        __assert_fail("new_handles",
                      "/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/../3rdparty/mattias/strpool.h"
                      ,0x365,"void strpool_internal_expand_handles(strpool_t *)");
      }
      memcpy(__dest,pool->handles,(long)pool->handle_count << 3);
      (**pool->memctx)(pool->handles,0,0,0,0,0,*(undefined8 *)((long)pool->memctx + 8));
      pool->handles = __dest;
      iVar9 = pool->handle_count;
      __dest[iVar9].counter = 1;
      pool->handle_count = iVar9 + 1;
    }
    else {
      if (pool->handle_freelist_tail == iVar9) {
        pool->handle_freelist_tail = pool->handles[lVar18].entry_index;
      }
      pool->handle_freelist_head = pool->handles[lVar18].entry_index;
    }
  }
  iVar15 = pool->entry_count;
  pool->handles[iVar9].entry_index = iVar15;
  psVar13 = pool->entries + iVar15;
  pool->entry_count = iVar15 + 1;
  iVar15 = length + 9;
  iVar8 = pool->min_data_size;
  if (pool->min_data_size <= iVar15) {
    iVar8 = iVar15;
  }
  uVar22 = iVar8 - 1U >> 1 | iVar8 - 1U;
  uVar22 = uVar22 >> 2 | uVar22;
  uVar22 = uVar22 >> 4 | uVar22;
  uVar22 = uVar22 >> 8 | uVar22;
  uVar22 = uVar22 >> 0x10 | uVar22;
  iVar8 = uVar22 + 1 + (uint)(uVar22 == 0xffffffff);
  uVar21 = (ulong)pool->block_count;
  bVar28 = 0 < (long)uVar21;
  if (0 < (long)uVar21) {
    psVar5 = pool->blocks;
    bVar28 = true;
    uVar19 = 0;
    do {
      uVar22 = psVar5[uVar19].free_list;
      uVar24 = 0xffffffff;
      do {
        bVar7 = true;
        if ((int)uVar22 < 0) goto LAB_00103a42;
        pcVar6 = psVar5[uVar19].data;
        psVar1 = (strpool_t *)(pcVar6 + uVar22);
        iVar3 = *(int *)(pcVar6 + uVar22);
        if (iVar3 / 2 < iVar8) {
          iVar17 = 6;
          if (iVar8 <= iVar3) {
            if ((int)uVar24 < 0) {
              psVar5[uVar19].free_list = *(int *)((long)&psVar1->memctx + 4);
            }
            else {
              *(undefined4 *)(pcVar6 + uVar24 + 4) = *(undefined4 *)((long)&psVar1->memctx + 4);
            }
            iVar17 = 1;
            psVar27 = psVar1;
            iVar15 = iVar3;
          }
        }
        else {
          uVar24 = (ulong)uVar22;
          uVar22 = *(uint *)((long)&psVar1->memctx + 4);
          iVar17 = 0;
        }
      } while (iVar17 == 0);
      if (iVar17 != 6) {
        bVar7 = iVar8 <= iVar3 / 2;
      }
LAB_00103a42:
      if (!bVar7) break;
      uVar19 = uVar19 + 1;
      bVar28 = uVar19 < uVar21;
    } while (uVar19 != uVar21);
  }
  if (!bVar28) {
    psVar5 = pool->blocks;
    iVar15 = pool->current_block;
    psVar27 = (strpool_t *)psVar5[iVar15].tail;
    if ((*(int *)&psVar5[iVar15].data - (int)psVar27) + psVar5[iVar15].capacity < iVar8) {
      iVar15 = pool->block_size;
      if (pool->block_size < iVar8) {
        iVar15 = iVar8;
      }
      iVar15 = strpool_internal_add_block(pool,iVar15);
      pool->current_block = iVar15;
      ppcVar14 = &pool->blocks[iVar15].tail;
      psVar27 = (strpool_t *)*ppcVar14;
    }
    else {
      ppcVar14 = &psVar5[iVar15].tail;
    }
    *ppcVar14 = (char *)((long)&psVar27->memctx + (long)iVar8);
    iVar15 = iVar8;
  }
  psVar13->hash_slot = (int)uVar10;
  psVar13->handle_index = iVar9;
  psVar13->data = (char *)psVar27;
  psVar13->size = iVar15;
  psVar13->length = length;
  psVar13->refcount = 0;
  *(uint *)&psVar27->memctx = uVar25;
  *(int *)((long)&psVar27->memctx + 4) = length;
  memcpy(&psVar27->ignore_case,string,__n);
  *(undefined1 *)((long)&psVar27->ignore_case + __n) = 0;
  return (long)(iVar9 + 1) & pool->index_mask |
         ((long)pool->handles[iVar9].counter & pool->counter_mask) <<
         ((byte)pool->counter_shift & 0x3f);
}

Assistant:

STRPOOL_U64 strpool_inject( strpool_t* pool, char const* string, int length )
    {
    if( !string || length < 0 ) return 0;

    STRPOOL_U32 hash = strpool_internal_find_in_blocks( pool, string, length );
    // If no stored hash, calculate it from data
    if( !hash ) hash = strpool_internal_calculate_hash( string, length, pool->ignore_case ); 

    // Return handle to existing string, if it is already in pool
    int base_slot = (int)( hash & (STRPOOL_U32)( pool->hash_capacity - 1 ) );
    int base_count = pool->hash_table[ base_slot ].base_count;
    int slot = base_slot;
    int first_free = slot;
    while( base_count > 0 )
        {
        STRPOOL_U32 slot_hash = pool->hash_table[ slot ].hash_key;
        if( slot_hash == 0 && pool->hash_table[ first_free ].hash_key != 0 ) first_free = slot;
        int slot_base = (int)( slot_hash & (STRPOOL_U32)( pool->hash_capacity - 1 ) );
        if( slot_base == base_slot ) 
            {
            STRPOOL_ASSERT( base_count > 0 );
            --base_count;
            if( slot_hash == hash )
                {
                int index = pool->hash_table[ slot ].entry_index;
                strpool_internal_entry_t* entry = &pool->entries[ index ];
                if( entry->length == length && 
                    ( 
                       ( !pool->ignore_case &&   STRPOOL_MEMCMP( entry->data + 2 * sizeof( STRPOOL_U32 ), string, (size_t)length ) == 0 )
                    || (  pool->ignore_case && STRPOOL_STRNICMP( entry->data + 2 * sizeof( STRPOOL_U32 ), string, (size_t)length ) == 0 ) 
                    ) 
                  )
                    {
                    int handle_index = entry->handle_index;
                    return strpool_internal_make_handle( handle_index, pool->handles[ handle_index ].counter, 
                        pool->index_mask, pool->counter_shift, pool->counter_mask );
                    }
                }
            }
        slot = ( slot + 1 ) & ( pool->hash_capacity - 1 );
        }   

    // This is a new string, so let's add it

    if( pool->entry_count >= ( pool->hash_capacity  - pool->hash_capacity / 3 ) )
        {
        strpool_internal_expand_hash_table( pool );

        base_slot = (int)( hash & (STRPOOL_U32)( pool->hash_capacity - 1 ) );
        slot = base_slot;
        first_free = slot;
        while( base_count )
            {
            STRPOOL_U32 slot_hash = pool->hash_table[ slot ].hash_key;
            if( slot_hash == 0 && pool->hash_table[ first_free ].hash_key != 0 ) first_free = slot;
            int slot_base = (int)( slot_hash & (STRPOOL_U32)( pool->hash_capacity - 1 ) );
            if( slot_base == base_slot )  --base_count;
            slot = ( slot + 1 ) & ( pool->hash_capacity - 1 );
            }       
        }
        
    slot = first_free;
    while( pool->hash_table[ slot ].hash_key )
        slot = ( slot + 1 ) & ( pool->hash_capacity - 1 );

    if( pool->entry_count >= pool->entry_capacity )
        strpool_internal_expand_entries( pool );

    STRPOOL_ASSERT( !pool->hash_table[ slot ].hash_key && ( hash & ( (STRPOOL_U32) pool->hash_capacity - 1 ) ) == (STRPOOL_U32) base_slot );
    STRPOOL_ASSERT( hash );
    pool->hash_table[ slot ].hash_key = hash;
    pool->hash_table[ slot ].entry_index = pool->entry_count;
    ++pool->hash_table[ base_slot ].base_count;

    int handle_index;

    if( pool->handle_count < pool->handle_capacity )
        {
        handle_index = pool->handle_count;
        pool->handles[ pool->handle_count ].counter = 1;
        ++pool->handle_count;           
        }
    else if( pool->handle_freelist_head >= 0 )
        {
        handle_index = pool->handle_freelist_head;
        if( pool->handle_freelist_tail == pool->handle_freelist_head ) 
            pool->handle_freelist_tail = pool->handles[ pool->handle_freelist_head ].entry_index;
        pool->handle_freelist_head = pool->handles[ pool->handle_freelist_head ].entry_index;                       
        }
    else
        {
        strpool_internal_expand_handles( pool );
        handle_index = pool->handle_count;
        pool->handles[ pool->handle_count ].counter = 1;
        ++pool->handle_count;           
        }

    pool->handles[ handle_index ].entry_index = pool->entry_count;
        
    strpool_internal_entry_t* entry = &pool->entries[ pool->entry_count ];
    ++pool->entry_count;
        
    int data_size = length + 1 + (int) ( 2 * sizeof( STRPOOL_U32 ) );
    char* data = strpool_internal_get_data_storage( pool, data_size, &data_size );
    entry->hash_slot = slot;
    entry->handle_index = handle_index;
    entry->data = data;
    entry->size = data_size;
    entry->length = length;
    entry->refcount = 0;

    *(STRPOOL_U32*)(data) = hash;
    data += sizeof( STRPOOL_U32 );
    *(STRPOOL_U32*)(data) = (STRPOOL_U32) length;
    data += sizeof( STRPOOL_U32 );
    STRPOOL_MEMCPY( data, string, (size_t) length ); 
    data[ length ] = 0; // Ensure trailing zero

    return strpool_internal_make_handle( handle_index, pool->handles[ handle_index ].counter, pool->index_mask, 
        pool->counter_shift, pool->counter_mask );
    }